

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_periodChecking_TestShell::
TEST_MemoryLeakDetectorTest_periodChecking_TestShell
          (TEST_MemoryLeakDetectorTest_periodChecking_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_00361c50;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, periodChecking)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_disabled));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_enabled));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}